

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_key_value_api_test.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_1bfdaf::BaseKeyValAPI::SetUp(BaseKeyValAPI *this)

{
  aom_codec_iface_t *paVar1;
  pointer *__ptr;
  SEARCH_METHODS *pSVar2;
  AssertHelper local_3d8;
  AssertionResult gtest_ar_2;
  AssertHelper local_3c0;
  aom_codec_dec_cfg_t dec_cfg;
  aom_codec_enc_cfg_t enc_cfg;
  
  paVar1 = aom_codec_av1_cx();
  gtest_ar_2.success_ = false;
  gtest_ar_2._1_3_ = 0;
  local_3d8.data_._0_4_ = aom_codec_enc_config_default(paVar1,&enc_cfg,0);
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            ((internal *)&dec_cfg,"AOM_CODEC_OK",
             "aom_codec_enc_config_default(iface_cx, &enc_cfg, usage)",
             (aom_codec_err_t *)&gtest_ar_2,(aom_codec_err_t *)&local_3d8);
  if ((char)dec_cfg.threads == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (dec_cfg._8_8_ == 0) {
      pSVar2 = "";
    }
    else {
      pSVar2 = *(SEARCH_METHODS **)dec_cfg._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_key_value_api_test.cc"
               ,0x26,(char *)pSVar2);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if ((long *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&dec_cfg.h);
  gtest_ar_2.success_ = false;
  gtest_ar_2._1_3_ = 0;
  local_3d8.data_._0_4_ = aom_codec_enc_init_ver(&this->enc_,paVar1,&enc_cfg,0,0x1d);
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            ((internal *)&dec_cfg,"AOM_CODEC_OK",
             "aom_codec_enc_init_ver(&enc_, iface_cx, &enc_cfg, usage, (10 + (7 + (9)) + 3))",
             (aom_codec_err_t *)&gtest_ar_2,(aom_codec_err_t *)&local_3d8);
  if ((char)dec_cfg.threads == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (dec_cfg._8_8_ == 0) {
      pSVar2 = "";
    }
    else {
      pSVar2 = *(SEARCH_METHODS **)dec_cfg._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_key_value_api_test.cc"
               ,0x28,(char *)pSVar2);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if ((long *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&dec_cfg.h);
  paVar1 = aom_codec_av1_dx();
  dec_cfg.threads = 0;
  dec_cfg.w = 0;
  dec_cfg.h = 0;
  dec_cfg.allow_lowbitdepth = 1;
  local_3d8.data_._0_4_ = 0;
  local_3c0.data_._0_4_ = aom_codec_dec_init_ver(&this->dec_,paVar1,&dec_cfg,0,0x16);
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            ((internal *)&gtest_ar_2,"AOM_CODEC_OK",
             "aom_codec_dec_init_ver(&dec_, iface_dx, &dec_cfg, 0, (6 + (7 + (9))))",
             (aom_codec_err_t *)&local_3d8,(aom_codec_err_t *)&local_3c0);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_3d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pSVar2 = "";
    }
    else {
      pSVar2 = *(SEARCH_METHODS **)
                gtest_ar_2.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_key_value_api_test.cc"
               ,0x2e,(char *)pSVar2);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_3d8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if ((long *)CONCAT44(local_3d8.data_._4_4_,(aom_codec_err_t)local_3d8.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_3d8.data_._4_4_,(aom_codec_err_t)local_3d8.data_) + 8))()
      ;
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  return;
}

Assistant:

void SetUp() override {
#if CONFIG_AV1_ENCODER
    aom_codec_iface_t *iface_cx = aom_codec_av1_cx();
    aom_codec_enc_cfg_t enc_cfg;
#if CONFIG_REALTIME_ONLY
    const int usage = 1;
#else
    const int usage = 0;
#endif
    EXPECT_EQ(AOM_CODEC_OK,
              aom_codec_enc_config_default(iface_cx, &enc_cfg, usage));
    EXPECT_EQ(AOM_CODEC_OK,
              aom_codec_enc_init(&enc_, iface_cx, &enc_cfg, usage));
#endif
#if CONFIG_AV1_DECODER
    aom_codec_iface_t *iface_dx = aom_codec_av1_dx();
    aom_codec_dec_cfg_t dec_cfg = { 0, 0, 0, !FORCE_HIGHBITDEPTH_DECODING };

    EXPECT_EQ(AOM_CODEC_OK, aom_codec_dec_init(&dec_, iface_dx, &dec_cfg, 0));
#endif
  }